

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-grammar.cpp
# Opt level: O1

pair<unsigned_int,_const_char_*> parse_hex(char *src,int size)

{
  char cVar1;
  bool bVar2;
  uint uVar3;
  ulong uVar4;
  runtime_error *this;
  long *plVar5;
  char *pcVar6;
  long *plVar7;
  int iVar8;
  pair<unsigned_int,_const_char_*> pVar9;
  long *local_a8;
  long local_a0;
  long local_98;
  long lStack_90;
  long *local_88;
  long local_80;
  long local_78;
  long lStack_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar6 = src + (uint)size;
  uVar4 = 0;
  if (size != 0) {
    while( true ) {
      cVar1 = *src;
      iVar8 = (int)cVar1;
      if (iVar8 == 0) break;
      uVar3 = (int)uVar4 * 0x10;
      uVar4 = (ulong)uVar3;
      if ((byte)(cVar1 + 0x9fU) < 6) {
        uVar4 = (ulong)((uVar3 + iVar8) - 0x57);
LAB_00198619:
        bVar2 = true;
      }
      else {
        if ((byte)(cVar1 + 0xbfU) < 6) {
          uVar4 = (ulong)((uVar3 + iVar8) - 0x37);
          goto LAB_00198619;
        }
        if ((byte)(cVar1 - 0x30U) < 10) {
          uVar4 = (ulong)((uVar3 + iVar8) - 0x30);
          goto LAB_00198619;
        }
        bVar2 = false;
      }
      if ((!bVar2) || (src = src + 1, pcVar6 <= src)) break;
    }
  }
  if (src != pcVar6) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_68,size);
    std::operator+(&local_48,"expecting ",&local_68);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_48);
    local_a8 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_a8 == plVar7) {
      local_98 = *plVar7;
      lStack_90 = plVar5[3];
      local_a8 = &local_98;
    }
    else {
      local_98 = *plVar7;
    }
    local_a0 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_a8);
    local_88 = (long *)*plVar5;
    plVar7 = plVar5 + 2;
    if (local_88 == plVar7) {
      local_78 = *plVar7;
      lStack_70 = plVar5[3];
      local_88 = &local_78;
    }
    else {
      local_78 = *plVar7;
    }
    local_80 = plVar5[1];
    *plVar5 = (long)plVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::runtime_error::runtime_error(this,(string *)&local_88);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  pVar9.second = src;
  pVar9._0_8_ = uVar4;
  return pVar9;
}

Assistant:

static std::pair<uint32_t, const char *> parse_hex(const char * src, int size) {
    const char * pos   = src;
    const char * end   = src + size;
    uint32_t     value = 0;
    for ( ; pos < end && *pos; pos++) {
        value <<= 4;
        char c = *pos;
        if ('a' <= c && c <= 'f') {
            value += c - 'a' + 10;
        } else if ('A' <= c && c <= 'F') {
            value += c - 'A' + 10;
        } else if ('0' <= c && c <= '9') {
            value += c - '0';
        } else {
            break;
        }
    }
    if (pos != end) {
        throw std::runtime_error("expecting " + std::to_string(size) + " hex chars at " + src);
    }
    return std::make_pair(value, pos);
}